

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCVWarp.cpp
# Opt level: O1

void writeIni(string *iniwpath)

{
  size_t sVar1;
  long *plVar2;
  ofstream inifileout;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210,(string *)iniwpath,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#ini_file_for_OCVWarp--Comments_start_with_#",0x2c);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#Enter_each_parameter_in_the_line_below_the_comment. ",0x35);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#AngleXinDegrees_float",0x16);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  sVar1 = strlen(anglexstr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,anglexstr,sVar1);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#AngleXIncrementperFrameinDegrees_float",0x27);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  sVar1 = strlen(anglexincrstr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,anglexincrstr,sVar1);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#AngleYinDegrees_float",0x16);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  sVar1 = strlen(angleystr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,angleystr,sVar1);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#AngleYIncrementperFrameinDegrees_float",0x27);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  sVar1 = strlen(angleyincrstr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,angleyincrstr,sVar1);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#Output_width_pixels",0x14);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  plVar2 = (long *)std::ostream::operator<<((ostream *)&local_210,outputw);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#Output_height_pixels",0x15);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  plVar2 = (long *)std::ostream::operator<<((ostream *)&local_210,outputh);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#0=360Fisheye_1=180Fisheye_etc--see_transformtype.txt",0x35);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  plVar2 = (long *)std::ostream::operator<<((ostream *)&local_210,transformtype);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,
             "#Output_video_codec_fourcc__use_NULL_for_same_as_input--see_fourcc.txt",0x46);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  sVar1 = strlen(outputfourccstr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,outputfourccstr,sVar1);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#Path_to_Map_file_used_for_transformtype_4_&_5",0x2e);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"EP_xyuv_1920.map",0x10);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#Output_fps_-1=same_as_input__0=image_sequence",0x2e);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  sVar1 = strlen(outputfpsstr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,outputfpsstr,sVar1);
  std::ios::widen((char)(ostream *)&local_210 + (char)*(undefined8 *)(local_210 + -0x18));
  std::ostream::put((char)&local_210);
  std::ostream::flush();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _rfind;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

inline void writeIni(std::string iniwpath) 
{
	try {
		std::ofstream inifileout(iniwpath);
		inifileout << "#ini_file_for_OCVWarp--Comments_start_with_#" << std::endl;
		inifileout << "#Enter_each_parameter_in_the_line_below_the_comment. " << std::endl;
		inifileout << "#AngleXinDegrees_float" << std::endl;
		inifileout << anglexstr << std::endl;
		inifileout << "#AngleXIncrementperFrameinDegrees_float" << std::endl;
		inifileout << anglexincrstr << std::endl;
		inifileout << "#AngleYinDegrees_float" << std::endl;
		inifileout << angleystr << std::endl;
		inifileout << "#AngleYIncrementperFrameinDegrees_float" << std::endl;
		inifileout << angleyincrstr << std::endl;
		inifileout << "#Output_width_pixels" << std::endl;
		inifileout << outputw << std::endl;
		inifileout << "#Output_height_pixels" << std::endl;
		inifileout << outputh << std::endl;
		inifileout << "#0=360Fisheye_1=180Fisheye_etc--see_transformtype.txt" << std::endl;
		inifileout << transformtype << std::endl;
		inifileout << "#Output_video_codec_fourcc__use_NULL_for_same_as_input--see_fourcc.txt" << std::endl;
		inifileout << outputfourccstr << std::endl;		
		inifileout << "#Path_to_Map_file_used_for_transformtype_4_&_5" << std::endl;
		inifileout << "EP_xyuv_1920.map" << std::endl;
		inifileout << "#Output_fps_-1=same_as_input__0=image_sequence" << std::endl;
		inifileout << outputfpsstr << std::endl;
		
	} catch (int) {
		std::cerr << "An error occured writing to ini file."<< std::endl ; 		
	}
}